

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

TypeDescriptor * __thiscall
CallStatement::evaluateCallExpr
          (CallStatement *this,SymTab *symTab,
          vector<Statement_*,_std::allocator<Statement_*>_> *stack,string *id)

{
  code *pcVar1;
  size_type sVar2;
  int local_2c;
  int i;
  string *id_local;
  vector<Statement_*,_std::allocator<Statement_*>_> *stack_local;
  SymTab *symTab_local;
  CallStatement *this_local;
  
  std::operator<<((ostream *)&std::cout,"HERE");
  local_2c = 0;
  while( true ) {
    sVar2 = std::vector<Statement_*,_std::allocator<Statement_*>_>::size(stack);
    if (sVar2 <= (ulong)(long)local_2c) break;
    local_2c = local_2c + 1;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TypeDescriptor *CallStatement::evaluateCallExpr(SymTab &symTab,std::vector<Statement*>stack,std::string id) {
//    Functions().setStack();
    //or(int i = 0; i < )
    std::cout << "HERE";
    //std::vector<Statement*>stack = this->_functionStack;
    for(int i = 0; i < stack.size();i++){
        //stack[i]->id();
    }
//    if(findFunction(this)){
//        Function *function = returnFunction(this);
//        SymTab symTab1;
//        for(int i = 0; i < function->paramenters().size(); i++){
//            //symTab1.setValueFor(function->pa)
//        }
//        function->evaluate(symTab1);
//    }
    //return nullptr;
}